

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void update_thr_fact(int (*factor_buf) [169],THR_MODES best_mode_index,THR_MODES mode_start,
                    THR_MODES mode_end,BLOCK_SIZE min_size,BLOCK_SIZE max_size,
                    int max_rd_thresh_factor)

{
  int iVar1;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar2;
  int iVar3;
  undefined7 in_register_00000031;
  BLOCK_SIZE bs;
  BLOCK_SIZE BVar4;
  
  for (uVar2 = CONCAT71(in_register_00000011,mode_start) & 0xffffffff; BVar4 = min_size,
      uVar2 < (CONCAT71(in_register_00000009,mode_end) & 0xffffffff); uVar2 = uVar2 + 1) {
    for (; BVar4 <= max_size; BVar4 = BVar4 + BLOCK_4X8) {
      iVar1 = factor_buf[BVar4][uVar2];
      if (uVar2 == (CONCAT71(in_register_00000031,best_mode_index) & 0xffffffff)) {
        iVar3 = iVar1 - (iVar1 >> 4);
      }
      else {
        iVar3 = iVar1 + 1;
        if (max_rd_thresh_factor <= iVar1 + 1) {
          iVar3 = max_rd_thresh_factor;
        }
      }
      factor_buf[BVar4][uVar2] = iVar3;
    }
  }
  return;
}

Assistant:

static inline void update_thr_fact(int (*factor_buf)[MAX_MODES],
                                   THR_MODES best_mode_index,
                                   THR_MODES mode_start, THR_MODES mode_end,
                                   BLOCK_SIZE min_size, BLOCK_SIZE max_size,
                                   int max_rd_thresh_factor) {
  for (THR_MODES mode = mode_start; mode < mode_end; ++mode) {
    for (BLOCK_SIZE bs = min_size; bs <= max_size; ++bs) {
      int *const fact = &factor_buf[bs][mode];
      if (mode == best_mode_index) {
        *fact -= (*fact >> RD_THRESH_LOG_DEC_FACTOR);
      } else {
        *fact = AOMMIN(*fact + RD_THRESH_INC, max_rd_thresh_factor);
      }
    }
  }
}